

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O3

void Gia_ManCheckFalseOne
               (Gia_Man_t *p,int iOut,int nTimeOut,Vec_Wec_t *vHooks,int fVerbose,int fVeryVerbose)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pObj;
  Vec_Int_t *p_00;
  int *piVar7;
  Vec_Int_t *__ptr;
  Vec_Int_t *__ptr_00;
  sat_solver *s;
  int iVar8;
  int iVar1;
  uint uVar9;
  int iVar0;
  long lVar10;
  abctime aVar11;
  uint *puVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  Gia_Obj_t *pGVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  timespec ts;
  int iFanin;
  undefined8 in_stack_ffffffffffffff18;
  timespec local_80;
  int local_6c;
  uint local_68;
  int local_64;
  long local_60;
  ulong local_58;
  long local_50;
  Vec_Wec_t *local_48;
  long local_40;
  int local_34;
  
  pGVar16 = (Gia_Obj_t *)(ulong)(uint)fVerbose;
  if ((iOut < 0) || (p->vCos->nSize <= iOut)) {
LAB_006db72b:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar5 = p->vCos->pArray[(uint)iOut];
  local_6c = fVeryVerbose;
  local_68 = iOut;
  local_48 = vHooks;
  if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_006db70c:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pObj = p->pObjs + iVar5;
  iVar5 = p->nLevels;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar6 = iVar5;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar6;
  if (iVar6 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar6 << 2);
  }
  p_00->pArray = piVar7;
  __ptr = Gia_ManCollectPath(p,pObj);
  iVar5 = clock_gettime(3,&local_80);
  if (iVar5 < 0) {
    local_60 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
    local_60 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_80.tv_sec * -1000000;
  }
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->nObjs)) {
    local_34 = (int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555 -
               (*(uint *)pObj & 0x1fffffff);
    __ptr_00 = Gia_ManCollectNodesCis(p,&local_34,1);
    uVar9 = __ptr_00->nSize;
    lVar10 = (long)(int)uVar9;
    if (0 < lVar10) {
      piVar3 = __ptr_00->pArray;
      lVar13 = 0;
      do {
        uVar9 = uVar9 - 1;
        iVar5 = piVar3[lVar13];
        if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_006db70c;
        pGVar16 = p->pObjs;
        if (pGVar16 == (Gia_Obj_t *)0x0) break;
        pGVar16[iVar5].Value = uVar9;
        lVar13 = lVar13 + 1;
      } while (lVar10 != lVar13);
    }
    local_64 = fVerbose;
    if ((-1 < (int)(uint)*(undefined8 *)pObj) ||
       (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsCo(pPivot)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFalse.c"
                    ,0xb6,"void Gia_ManCheckFalseOne(Gia_Man_t *, int, int, Vec_Wec_t *, int, int)")
      ;
    }
    s = sat_solver_new();
    local_40 = (long)nTimeOut;
    if (nTimeOut == 0) {
      aVar11 = 0;
    }
    else {
      lVar10 = local_40 * 1000000;
      iVar5 = clock_gettime(3,&local_80);
      if (iVar5 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
      }
      aVar11 = lVar13 + lVar10;
    }
    s->nRuntimeLimit = aVar11;
    uVar9 = __ptr->nSize;
    uVar20 = (ulong)uVar9;
    iVar6 = uVar9 * 3;
    sat_solver_setnvars(s,iVar6 + __ptr_00->nSize * 2);
    iVar5 = __ptr_00->nSize;
    iVar8 = iVar5 + iVar6;
    if (0 < iVar5) {
      lVar10 = 0;
      do {
        iVar18 = __ptr_00->pArray[lVar10];
        if (((long)iVar18 < 0) || (p->nObjs <= iVar18)) goto LAB_006db70c;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar2 = p->pObjs + iVar18;
        uVar19 = *(ulong *)pGVar2;
        if ((uVar19 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar19) {
          sat_solver_add_and(s,pGVar2->Value + iVar6,pGVar2[-(uVar19 & 0x1fffffff)].Value + iVar6,
                             pGVar2[-(uVar19 >> 0x20 & 0x1fffffff)].Value + iVar6,
                             (uint)(uVar19 >> 0x1d) & 1,(uint)(uVar19 >> 0x3d) & 1,
                             (int)in_stack_ffffffffffffff18);
          uVar19 = *(ulong *)pGVar2;
          uVar15 = (uint)(uVar19 >> 0x1d) & 1;
          pGVar16 = (Gia_Obj_t *)(ulong)uVar15;
          sat_solver_add_and(s,pGVar2->Value + iVar8,pGVar2[-(uVar19 & 0x1fffffff)].Value + iVar8,
                             pGVar2[-(uVar19 >> 0x20 & 0x1fffffff)].Value + iVar8,uVar15,
                             (uint)(uVar19 >> 0x3d) & 1,(int)in_stack_ffffffffffffff18);
          iVar5 = __ptr_00->nSize;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < iVar5);
    }
    if ((int)uVar9 < 1) {
      lVar10 = 0;
    }
    else {
      piVar7 = __ptr->pArray;
      local_50 = (ulong)(uVar9 * 2 - 2) + 1;
      local_58 = (ulong)(uVar9 - 1);
      iVar5 = 0;
      uVar19 = 0;
      do {
        iVar18 = piVar7[uVar19];
        if (((long)iVar18 < 0) || (p->nObjs <= iVar18)) goto LAB_006db70c;
        pGVar2 = p->pObjs;
        if (pGVar2 == (Gia_Obj_t *)0x0) break;
        pGVar1 = pGVar2 + iVar18;
        uVar14 = *(ulong *)pGVar1;
        iVar18 = (int)uVar19;
        if ((uVar14 & 0x1fffffff) == 0x1fffffff || (int)(uint)uVar14 < 0) {
          if ((~(uint)uVar14 & 0x9fffffff) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFalse.c"
                          ,0xe7,
                          "void Gia_ManCheckFalseOne(Gia_Man_t *, int, int, Vec_Wec_t *, int, int)")
            ;
          }
          sat_solver_add_xor(s,iVar18,pGVar1->Value + iVar6,pGVar1->Value + iVar8,(int)pGVar16);
        }
        else {
          if (uVar19 == 0) {
            __assert_fail("i > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFalse.c"
                          ,0xce,
                          "void Gia_ManCheckFalseOne(Gia_Man_t *, int, int, Vec_Wec_t *, int, int)")
            ;
          }
          uVar15 = piVar7[uVar19 - 1];
          if (((long)(int)uVar15 < 0) || ((uint)p->nObjs <= uVar15)) goto LAB_006db70c;
          uVar17 = (uint)(uVar14 >> 0x20);
          if (pGVar2 + (int)uVar15 == pGVar1 + -(uVar14 & 0x1fffffff)) {
            sat_solver_add_and(s,uVar9 + iVar18,(int)local_58 + iVar18,
                               pGVar1[-(uVar14 >> 0x20 & 0x1fffffff)].Value + iVar6,
                               (uint)(uVar14 >> 0x1d) & 1,uVar17 >> 0x1d & 1,
                               (int)in_stack_ffffffffffffff18);
            uVar14 = *(ulong *)pGVar1;
            iVar1 = pGVar1[-(uVar14 >> 0x20 & 0x1fffffff)].Value + iVar8;
            uVar15 = (uint)(uVar14 >> 0x1d);
            uVar17 = (uint)(uVar14 >> 0x20);
            iVar0 = (int)local_50 + iVar18;
          }
          else {
            if (pGVar2 + (int)uVar15 != pGVar1 + -(ulong)(uVar17 & 0x1fffffff)) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFalse.c"
                            ,0xe2,
                            "void Gia_ManCheckFalseOne(Gia_Man_t *, int, int, Vec_Wec_t *, int, int)"
                           );
            }
            sat_solver_add_and(s,uVar9 + iVar18,pGVar1[-(uVar14 & 0x1fffffff)].Value + iVar6,
                               (int)local_58 + iVar18,(uint)(uVar14 >> 0x1d) & 1,uVar17 >> 0x1d & 1,
                               (int)in_stack_ffffffffffffff18);
            uVar14 = *(ulong *)pGVar1;
            iVar0 = pGVar1[-(ulong)((uint)uVar14 & 0x1fffffff)].Value + iVar8;
            uVar15 = (uint)(uVar14 >> 0x1d);
            uVar17 = (uint)(uVar14 >> 0x20);
            iVar1 = (int)local_50 + iVar18;
          }
          pGVar16 = (Gia_Obj_t *)(ulong)(uVar15 & 1);
          sat_solver_add_and(s,uVar9 * 2 + iVar18,iVar0,iVar1,uVar15 & 1,uVar17 >> 0x1d & 1,
                             (int)in_stack_ffffffffffffff18);
          sat_solver_add_xor(s,iVar18,uVar9 + iVar18,uVar9 * 2 + iVar18,(int)pGVar16);
        }
        Vec_IntPush(p_00,iVar5);
        uVar19 = uVar19 + 1;
        iVar5 = iVar5 + 2;
      } while (uVar20 != uVar19);
      piVar7 = p_00->pArray;
      lVar10 = (long)p_00->nSize;
    }
    uVar19 = 0;
    iVar5 = sat_solver_solve(s,piVar7,piVar7 + lVar10,local_40,0,0,0);
    puVar12 = (uint *)0x0;
    if (iVar5 == -1) {
      uVar19 = (ulong)(s->conf_final).size;
      puVar12 = (uint *)(s->conf_final).ptr;
      if (((int)puVar12[uVar19 - 1] < 0) || ((int)*puVar12 < 0)) goto LAB_006db788;
      uVar15 = puVar12[uVar19 - 1] >> 1;
      uVar17 = *puVar12 >> 1;
      if ((int)(uVar17 - uVar15) < 0x14) {
        iVar6 = uVar15 + (uVar15 == 0);
        uVar15 = iVar6 - 1;
        if (uVar15 <= uVar17) {
          uVar14 = (ulong)uVar15;
          iVar8 = (uVar17 - iVar6) + 2;
          do {
            if ((long)(int)uVar9 <= (long)uVar14) goto LAB_006db72b;
            iVar18 = __ptr->pArray[uVar14];
            if (((long)iVar18 < 0) || (local_48->nSize <= iVar18)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                            ,0xd1,"int Vec_WecLevelSize(Vec_Wec_t *, int)");
            }
            if (0 < local_48->pArray[iVar18].nSize) goto LAB_006db4e6;
            uVar14 = uVar14 + 1;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        if ((int)uVar9 <= (int)uVar17) goto LAB_006db72b;
        piVar3 = __ptr->pArray;
        iVar8 = piVar3[uVar17];
        if (((long)iVar8 < 0) || (local_48->nSize <= iVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                        ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        if ((int)uVar15 <= (int)uVar17) {
          pVVar4 = local_48->pArray;
          uVar14 = (ulong)uVar15;
          iVar6 = (uVar17 - iVar6) + 2;
          do {
            if (uVar20 <= uVar14) goto LAB_006db72b;
            Vec_IntPush(pVVar4 + iVar8,piVar3[uVar14]);
            uVar14 = uVar14 + 1;
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
        }
      }
    }
LAB_006db4e6:
    if (local_64 != 0) {
      pGVar16 = p->pObjs;
      if ((pObj < pGVar16) || (pGVar16 + p->nObjs <= pObj)) goto LAB_006db7a7;
      uVar15 = Gia_ObjLevelId((Gia_Man_t *)p->vLevels,
                              (int)((ulong)((long)pObj - (long)pGVar16) >> 2) * -0x55555555);
      printf("PO %6d : Level = %3d  ",(ulong)local_68,(ulong)uVar15);
      if (iVar5 == 1) {
        printf("There is no false path. ");
      }
      else if (iVar5 == 0) {
        printf("Timeout reached after %d seconds. ",(ulong)(uint)nTimeOut);
      }
      else {
        printf("False path contains %d nodes (out of %d):  ",uVar19 & 0xffffffff,uVar20);
        if ((int)*puVar12 < 0) {
LAB_006db788:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        uVar15 = *puVar12 >> 1;
        if ((int)uVar9 <= (int)uVar15) goto LAB_006db72b;
        printf("top = %d  ",(ulong)(uint)__ptr->pArray[uVar15]);
        if (0 < (int)uVar19 && local_6c != 0) {
          uVar20 = 0;
          do {
            if ((int)puVar12[uVar20] < 0) goto LAB_006db788;
            printf("%d ",(ulong)(puVar12[uVar20] >> 1));
            uVar20 = uVar20 + 1;
          } while ((uVar19 & 0xffffffff) != uVar20);
        }
        printf("  ");
      }
      iVar6 = 3;
      iVar5 = clock_gettime(3,&local_80);
      if (iVar5 < 0) {
        lVar10 = -1;
      }
      else {
        lVar10 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
      }
      lVar10 = lVar10 + local_60;
      Abc_Print(iVar6,"%s =","Time");
      Abc_Print(iVar6,"%9.2f sec\n",(double)lVar10 / 1000000.0);
    }
    sat_solver_delete(s);
    if (__ptr_00->pArray != (int *)0x0) {
      free(__ptr_00->pArray);
    }
    free(__ptr_00);
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    if (piVar7 != (lit *)0x0) {
      free(piVar7);
    }
    free(p_00);
    return;
  }
LAB_006db7a7:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManCheckFalseOne( Gia_Man_t * p, int iOut, int nTimeOut, Vec_Wec_t * vHooks, int fVerbose, int fVeryVerbose )
{
    sat_solver * pSat;
    Gia_Obj_t * pObj, * pFanin;
    Gia_Obj_t * pPivot = Gia_ManCo( p, iOut );
    Vec_Int_t * vLits = Vec_IntAlloc( p->nLevels );
    Vec_Int_t * vPath = Gia_ManCollectPath( p, pPivot );
    int nLits = 0, * pLits = NULL;
    int i, Shift[2], status;
    abctime clkStart = Abc_Clock();
    // collect objects and assign SAT variables
    int iFanin = Gia_ObjFaninId0p( p, pPivot );
    Vec_Int_t * vObjs = Gia_ManCollectNodesCis( p, &iFanin, 1 );
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
        pObj->Value = Vec_IntSize(vObjs) - 1 - i;
    assert( Gia_ObjIsCo(pPivot) );
    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_set_runtime_limit( pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    sat_solver_setnvars( pSat, 3 * Vec_IntSize(vPath) + 2 * Vec_IntSize(vObjs) );
    Shift[0] = 3 * Vec_IntSize(vPath);
    Shift[1] = 3 * Vec_IntSize(vPath) + Vec_IntSize(vObjs);
    // add CNF for the cone
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
    {
        if ( !Gia_ObjIsAnd(pObj) )
            continue;
        sat_solver_add_and( pSat, pObj->Value + Shift[0], 
            Gia_ObjFanin0(pObj)->Value + Shift[0], Gia_ObjFanin1(pObj)->Value + Shift[0], 
            Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
        sat_solver_add_and( pSat, pObj->Value + Shift[1], 
            Gia_ObjFanin0(pObj)->Value + Shift[1], Gia_ObjFanin1(pObj)->Value + Shift[1], 
            Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
    }
    // add CNF for the path
    Gia_ManForEachObjVec( vPath, p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            assert( i > 0 );
            pFanin = Gia_ManObj( p, Vec_IntEntry(vPath, i-1) );
            if ( pFanin == Gia_ObjFanin0(pObj) )
            {
                sat_solver_add_and( pSat, i + 1*Vec_IntSize(vPath), 
                    i-1 + 1*Vec_IntSize(vPath), Gia_ObjFanin1(pObj)->Value + Shift[0], 
                    Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
                sat_solver_add_and( pSat, i + 2*Vec_IntSize(vPath), 
                    i-1 + 2*Vec_IntSize(vPath), Gia_ObjFanin1(pObj)->Value + Shift[1], 
                    Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
            }
            else if ( pFanin == Gia_ObjFanin1(pObj) )
            {
                sat_solver_add_and( pSat, i + 1*Vec_IntSize(vPath), 
                    Gia_ObjFanin0(pObj)->Value + Shift[0], i-1 + 1*Vec_IntSize(vPath), 
                    Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
                sat_solver_add_and( pSat, i + 2*Vec_IntSize(vPath), 
                    Gia_ObjFanin0(pObj)->Value + Shift[1], i-1 + 2*Vec_IntSize(vPath), 
                    Gia_ObjFaninC0(pObj), Gia_ObjFaninC1(pObj), 0 ); 
            }
            else assert( 0 );
            sat_solver_add_xor( pSat, i, i + 1*Vec_IntSize(vPath), i + 2*Vec_IntSize(vPath), 0 );
        }
        else if ( Gia_ObjIsCi(pObj) )
            sat_solver_add_xor( pSat, i, pObj->Value + Shift[0], pObj->Value + Shift[1], 0 );
        else assert( 0 );
        Vec_IntPush( vLits, Abc_Var2Lit(i, 0) );
    }
    // call the SAT solver
    status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)nTimeOut, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status == l_False )
    {
        int iBeg, iEnd;
        nLits = sat_solver_final( pSat, &pLits );
        iBeg  = Abc_Lit2Var(pLits[nLits-1]);
        iEnd  = Abc_Lit2Var(pLits[0]);
        if ( iEnd - iBeg < 20 )
        {
            // check if nodes on the path are already used
            for ( i = Abc_MaxInt(iBeg-1, 0); i <= iEnd; i++ )
                if ( Vec_WecLevelSize(vHooks, Vec_IntEntry(vPath, i)) > 0 )
                    break;
            if ( i > iEnd )
            {
                Vec_Int_t * vHook = Vec_WecEntry(vHooks, Vec_IntEntry(vPath, iEnd));
                for ( i = Abc_MaxInt(iBeg-1, 0); i <= iEnd; i++ )
                    Vec_IntPush( vHook, Vec_IntEntry(vPath, i) );
            }
        }
    }
    if ( fVerbose )
    {
        printf( "PO %6d : Level = %3d  ", iOut, Gia_ObjLevel(p, pPivot) );
        if ( status == l_Undef )
            printf( "Timeout reached after %d seconds. ", nTimeOut );
        else if ( status == l_True )
            printf( "There is no false path. " );
        else
        {
            printf( "False path contains %d nodes (out of %d):  ", nLits, Vec_IntSize(vPath) );
            printf( "top = %d  ", Vec_IntEntry(vPath, Abc_Lit2Var(pLits[0])) );
            if ( fVeryVerbose )
                for ( i = 0; i < nLits; i++ )
                    printf( "%d ", Abc_Lit2Var(pLits[i]) );
            printf( "  " );
        }
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vObjs );
    Vec_IntFree( vPath );
    Vec_IntFree( vLits );
}